

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
::push_back(SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_false>
            *this,InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *Elt)

{
  void **ppvVar1;
  double dVar2;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  *this_00;
  
  this_00 = (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
             *)(this->
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
               ).super_SmallVectorBase.EndX;
  if ((tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
       *)(this->
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
         ).super_SmallVectorBase.CapacityX <= this_00) {
    grow(this,0);
    this_00 = (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
               *)(this->
                 super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
                 ).super_SmallVectorBase.EndX;
  }
  meta::impl::
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
  ::tuple_base(this_00,(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL,_27UL,_28UL,_29UL,_30UL,_31UL>,_Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<271U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_>,_Fixpp::Field<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_>,_Fixpp::Field<Fixpp::TagT<274U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<275U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<625U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<276U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<277U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<282U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<283U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<284U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<286U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<59U,_Fixpp::Type::Char>_>,_Fixpp::Field<Fixpp::TagT<432U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<110U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<18U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<287U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<37U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<299U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<288U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<289U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<346U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<546U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<811U,_Fixpp::Type::Float>_>,_Fixpp::Field<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                        *)Elt);
  dVar2 = (double)(Elt->
                  super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                  ).allBits.super__Base_bitset<1UL>._M_w;
  *(_WordT *)(this_00 + 1) =
       (Elt->
       super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
       ).requiredBits.super__Base_bitset<1UL>._M_w;
  this_00[1].super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_false>.
  value.val_.m_value = dVar2;
  SmallVector<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
  ::SmallVector((SmallVector<Fixpp::MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_10U>
                 *)&this_00[1].
                    super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<270U,_Fixpp::Type::Float>_>,_false>
                    .value.empty_,
                &(Elt->
                 super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                 ).unparsed);
  ppvVar1 = &(this->
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<269U,_Fixpp::Type::Char>_>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>,_Fixpp::TagT<274U,_Fixpp::Type::Char>,_Fixpp::TagT<275U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<625U,_Fixpp::Type::String>,_Fixpp::TagT<276U,_Fixpp::Type::String>,_Fixpp::TagT<277U,_Fixpp::Type::String>,_Fixpp::TagT<282U,_Fixpp::Type::String>,_Fixpp::TagT<283U,_Fixpp::Type::String>,_Fixpp::TagT<284U,_Fixpp::Type::String>,_Fixpp::TagT<286U,_Fixpp::Type::Char>,_Fixpp::TagT<59U,_Fixpp::Type::Char>,_Fixpp::TagT<432U,_Fixpp::Type::String>,_Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<110U,_Fixpp::Type::Float>,_Fixpp::TagT<18U,_Fixpp::Type::String>,_Fixpp::TagT<287U,_Fixpp::Type::Int>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::TagT<299U,_Fixpp::Type::String>,_Fixpp::TagT<288U,_Fixpp::Type::String>,_Fixpp::TagT<289U,_Fixpp::Type::String>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<546U,_Fixpp::Type::String>,_Fixpp::TagT<811U,_Fixpp::Type::Float>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>,_void>
             ).super_SmallVectorBase.EndX;
  *ppvVar1 = (void *)((long)*ppvVar1 + 0x4c0);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->EndX >= this->CapacityX))
      this->grow();
    ::new ((void*) this->end()) T(Elt);
    this->setEnd(this->end()+1);
  }